

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O3

int RGBColorTable(uint8_t *dst_argb,int dst_stride_argb,uint8_t *table_argb,int dst_x,int dst_y,
                 int width,int height)

{
  uint uVar1;
  int iVar2;
  code *pcVar3;
  uint8_t *puVar4;
  int iVar5;
  bool bVar6;
  
  iVar2 = -1;
  iVar5 = -1;
  if ((((-1 < (dst_y | dst_x)) && (iVar5 = iVar2, dst_argb != (uint8_t *)0x0)) &&
      (table_argb != (uint8_t *)0x0)) && ((0 < width && (0 < height)))) {
    bVar6 = width * 4 != dst_stride_argb;
    iVar5 = 0;
    if (bVar6) {
      iVar5 = dst_stride_argb;
    }
    iVar2 = 1;
    if (!bVar6) {
      iVar2 = height;
    }
    if (!bVar6) {
      height = 1;
    }
    uVar1 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar1 = InitCpuFlags();
    }
    if ((uVar1 & 0x10) == 0) {
      pcVar3 = RGBColorTableRow_C;
    }
    else {
      pcVar3 = RGBColorTableRow_X86;
    }
    puVar4 = dst_argb + (long)(dst_y * dst_stride_argb) + (long)(dst_x << 2);
    do {
      (*pcVar3)(puVar4,table_argb,iVar2 * width);
      puVar4 = puVar4 + iVar5;
      height = height + -1;
    } while (height != 0);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

LIBYUV_API
int RGBColorTable(uint8_t* dst_argb,
                  int dst_stride_argb,
                  const uint8_t* table_argb,
                  int dst_x,
                  int dst_y,
                  int width,
                  int height) {
  int y;
  void (*RGBColorTableRow)(uint8_t * dst_argb, const uint8_t* table_argb,
                           int width) = RGBColorTableRow_C;
  uint8_t* dst = dst_argb + dst_y * dst_stride_argb + dst_x * 4;
  if (!dst_argb || !table_argb || width <= 0 || height <= 0 || dst_x < 0 ||
      dst_y < 0) {
    return -1;
  }
  // Coalesce rows.
  if (dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    dst_stride_argb = 0;
  }
#if defined(HAS_RGBCOLORTABLEROW_X86)
  if (TestCpuFlag(kCpuHasX86)) {
    RGBColorTableRow = RGBColorTableRow_X86;
  }
#endif
  for (y = 0; y < height; ++y) {
    RGBColorTableRow(dst, table_argb, width);
    dst += dst_stride_argb;
  }
  return 0;
}